

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenArrayFill(BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenExpressionRef index,
                 BinaryenExpressionRef value,BinaryenExpressionRef size)

{
  ArrayFill *this;
  
  this = (ArrayFill *)MixedArena::allocSpace(&module->allocator,0x30,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)78>).super_Expression._id = ArrayFillId;
  (this->super_SpecificExpression<(wasm::Expression::Id)78>).super_Expression.type.id = 0;
  this->ref = ref;
  this->index = index;
  this->value = value;
  this->size = size;
  wasm::ArrayFill::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenArrayFill(BinaryenModuleRef module,
                                        BinaryenExpressionRef ref,
                                        BinaryenExpressionRef index,
                                        BinaryenExpressionRef value,
                                        BinaryenExpressionRef size) {
  return static_cast<Expression*>(Builder(*(Module*)module)
                                    .makeArrayFill((Expression*)ref,
                                                   (Expression*)index,
                                                   (Expression*)value,
                                                   (Expression*)size));
}